

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pfr.cpp
# Opt level: O0

int solver_R7Pfr(Matrix<double,_35,_1,_0,_35,_1> *data,
                Matrix<std::complex<double>,_4,_10,_0,_4,_10> *sols)

{
  ArrayBase<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>_>
  *other;
  ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_> this;
  ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> this_00;
  TransposeReturnType this_01;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>_> *in_RDI;
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>
  SVar1;
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> scale;
  Matrix<std::complex<double>,_10,_10,_0,_10,_10> V;
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> D;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eig;
  int i;
  Matrix<double,_10,_10,_0,_10,_10> AM;
  int ind [10];
  Matrix<double,_17,_10,_0,_17,_10> RR;
  Matrix<double,_26,_10,_0,_26,_10> C1;
  Matrix<double,_26,_26,_0,_26,_26> C0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_ffffffffffffb3e8;
  MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
  *in_stack_ffffffffffffb3f0;
  MatrixBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_> *in_stack_ffffffffffffb3f8;
  DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_> *in_stack_ffffffffffffb400;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_26,_10,_0,_26,_10>,__1,_10,_false>_>
  *in_stack_ffffffffffffb408;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_02;
  DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_> *in_stack_ffffffffffffb410;
  DenseBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_> *this_03;
  undefined4 in_stack_ffffffffffffb454;
  EigenBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *in_stack_ffffffffffffb458;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffb460;
  Matrix<double,_26,_10,_0,_26,_10> *in_stack_ffffffffffffb510;
  Matrix<double,_26,_26,_0,_26,_26> *in_stack_ffffffffffffb518;
  Matrix<double,_35,_1,_0,_35,_1> *in_stack_ffffffffffffb520;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffb608;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_3f88;
  int local_3e3c;
  undefined1 local_3b18 [7320];
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>
  local_1e80;
  DenseBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_> local_1e70 [7792];
  
  Eigen::Matrix<double,_26,_26,_0,_26,_26>::Matrix((Matrix<double,_26,_26,_0,_26,_26> *)0x6a042e);
  Eigen::Matrix<double,_26,_10,_0,_26,_10>::Matrix((Matrix<double,_26,_10,_0,_26,_10> *)0x6a0440);
  this_03 = local_1e70;
  Eigen::Matrix<double,_35,_1,_0,_35,_1>::Matrix
            ((Matrix<double,_35,_1,_0,_35,_1> *)in_stack_ffffffffffffb3f0,
             (Matrix<double,_35,_1,_0,_35,_1> *)in_stack_ffffffffffffb3e8);
  setup_elimination_template
            (in_stack_ffffffffffffb520,in_stack_ffffffffffffb518,in_stack_ffffffffffffb510);
  Eigen::MatrixBase<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>::lu
            ((MatrixBase<Eigen::Matrix<double,_26,_26,_0,_26,_26>_> *)in_stack_ffffffffffffb3f8);
  SVar1 = Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>>::
          solve<Eigen::Matrix<double,26,10,0,26,10>>
                    ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>_> *)
                     in_stack_ffffffffffffb400,in_stack_ffffffffffffb3f8);
  local_1e80 = SVar1;
  Eigen::Matrix<double,26,10,0,26,10>::operator=
            ((Matrix<double,_26,_10,_0,_26,_10> *)in_stack_ffffffffffffb3f0,
             (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>,_Eigen::Matrix<double,_26,_10,_0,_26,_10>_>_>
              *)in_stack_ffffffffffffb3e8);
  Eigen::PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_>::~PartialPivLU
            ((PartialPivLU<Eigen::Matrix<double,_26,_26,_0,_26,_26>_> *)0x6a04db);
  Eigen::Matrix<double,_17,_10,_0,_17,_10>::Matrix((Matrix<double,_17,_10,_0,_17,_10> *)0x6a04e8);
  Eigen::DenseBase<Eigen::Matrix<double,_26,_10,_0,_26,_10>_>::bottomRows<int>
            (this_03,(int)((ulong)in_RDI >> 0x20));
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_26,_10,_0,_26,_10>,_-1,_10,_false>_>::
  operator-(in_stack_ffffffffffffb408);
  Eigen::DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>::topRows<int>
            (in_stack_ffffffffffffb410,(int)((ulong)in_stack_ffffffffffffb408 >> 0x20));
  Eigen::Block<Eigen::Matrix<double,17,10,0,17,10>,-1,10,false>::operator=
            ((Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,__1,_10,_false> *)
             in_stack_ffffffffffffb3f0,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_26,_10,_0,_26,_10>,__1,_10,_false>_>_>
              *)in_stack_ffffffffffffb3e8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((Index)in_RDI,(Index)in_stack_ffffffffffffb410);
  Eigen::DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>::bottomRows<int>
            ((DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_> *)this_03,
             (int)((ulong)in_RDI >> 0x20));
  Eigen::Block<Eigen::Matrix<double,17,10,0,17,10>,-1,10,false>::operator=
            ((Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,__1,_10,_false> *)
             in_stack_ffffffffffffb3f0,in_stack_ffffffffffffb3e8);
  memcpy(local_3b18,&DAT_0071f4d0,0x28);
  Eigen::Matrix<double,_10,_10,_0,_10,_10>::Matrix((Matrix<double,_10,_10,_0,_10,_10> *)0x6a05b0);
  for (local_3e3c = 0; local_3e3c < 10; local_3e3c = local_3e3c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_17,_10,_0,_17,_10>_>::row
              (in_stack_ffffffffffffb400,(Index)in_stack_ffffffffffffb3f8);
    Eigen::DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::row
              ((DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffb400,
               (Index)in_stack_ffffffffffffb3f8);
    Eigen::Block<Eigen::Matrix<double,10,10,0,10,10>,1,10,false>::operator=
              ((Block<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_1,_10,_false> *)
               in_stack_ffffffffffffb3f0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_17,_10,_0,_17,_10>,_1,_10,_false>_> *)
               in_stack_ffffffffffffb3e8);
  }
  this_02 = &local_3f88;
  Eigen::EigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  EigenSolver<Eigen::Matrix<double,10,10,0,10,10>>
            (in_stack_ffffffffffffb460,in_stack_ffffffffffffb458,
             SUB41((uint)in_stack_ffffffffffffb454 >> 0x18,0));
  other = (ArrayBase<Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>_>
           *)Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues(this_02);
  Eigen::Matrix<std::complex<double>,10,1,0,10,1>::
  Matrix<Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
            ((Matrix<std::complex<double>,_10,_1,_0,_10,_1> *)in_stack_ffffffffffffb3f0,
             (EigenBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
             in_stack_ffffffffffffb3e8);
  Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
            (in_stack_ffffffffffffb608);
  Eigen::Matrix<std::complex<double>,10,10,0,10,10>::
  Matrix<Eigen::Matrix<std::complex<double>,_1,_1,0,_1,_1>>
            ((Matrix<std::complex<double>,_10,_10,_0,_10,_10> *)in_stack_ffffffffffffb3f0,
             (EigenBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_> *)
             in_stack_ffffffffffffb3e8);
  Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<std::complex<double>,__1,__1,_0,__1,__1> *)0x6a06d8);
  this = Eigen::MatrixBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>::array
                   ((MatrixBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_> *)
                    in_stack_ffffffffffffb3e8);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *)this.m_expression
             ,(Index)in_stack_ffffffffffffb3f8);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>::
  array(in_stack_ffffffffffffb3f0);
  Eigen::
  DenseBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>
  ::transpose((DenseBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>
               *)in_stack_ffffffffffffb3f0);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>>::operator/
            (in_RDI,other);
  Eigen::Matrix<std::complex<double>,10,1,0,10,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,std::complex<double>>,Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>const,Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>>const>>
            ((Matrix<std::complex<double>,_10,_1,_0,_10,_1> *)in_stack_ffffffffffffb3f0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_const_Eigen::Transpose<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>_>_>
              *)in_stack_ffffffffffffb3e8);
  this_00 = Eigen::MatrixBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>::array
                      ((MatrixBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *)
                       in_stack_ffffffffffffb3e8);
  Eigen::DenseBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>::Ones();
  this_01 = Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_> *)
                       in_stack_ffffffffffffb3e8);
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,1,0,10,1>>>
  ::operator*((MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_>
               *)this_02,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>_>
               *)this.m_expression);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_0>_>
  ::array((MatrixBase<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_0>_>
           *)this_00.m_expression);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,10,10,0,10,10>>>::
  operator*((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>_>
             *)in_RDI,
            (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_0>_>_>
             *)other);
  Eigen::Matrix<std::complex<double>,10,10,0,10,10>::operator=
            ((Matrix<std::complex<double>,_10,_10,_0,_10,_10> *)this_01.m_matrix,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>,_0>_>_>_>
              *)in_stack_ffffffffffffb3e8);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)this.m_expression,
             (Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *)this.m_expression
             ,(Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>::
  operator<<((DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
              *)this_00.m_expression,
             (DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
              *)this_01.m_matrix);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
  ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
                       *)0x6a0899);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)this.m_expression,
             (Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *)this.m_expression
             ,(Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>::
  operator<<((DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
              *)this_00.m_expression,
             (DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
              *)this_01.m_matrix);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
  ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
                       *)0x6a08fd);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)this.m_expression,
             (Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_> *)
             in_stack_ffffffffffffb3e8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>::
  operator<<((DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
              *)this_00.m_expression,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>_> *)
             this_01.m_matrix);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
  ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
                       *)0x6a0964);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)this.m_expression,
             (Index)this_00.m_expression);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *)this.m_expression
             ,(Index)this_00.m_expression);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>::
  array((MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>
         *)this_01.m_matrix);
  Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>::row
            ((DenseBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)this.m_expression,
             (Index)this_00.m_expression);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>::
  array((MatrixBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
         *)this_01.m_matrix);
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>_>
  ::pow<int>((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>_>
              *)SVar1.m_dec,(int *)SVar1.m_rhs);
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,1,10,false>>>
  ::operator/((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>_>
               *)in_RDI,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<std::complex<double>,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_10,_1,_1,_10>_>_>_>
               *)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,4,10,0,4,10>,1,10,false>>::
  operator<<((DenseBase<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
              *)this_00.m_expression,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<std::complex<double>,_std::complex<double>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>,_1,_10,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<std::complex<double>,_double>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_10,_1,_1,_10>_>_>_>_>
              *)this_01.m_matrix);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
  ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>,_1,_10,_false>_>
                       *)0x6a0a4f);
  Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver
            ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01.m_matrix);
  return 0;
}

Assistant:

int solver_R7Pfr(Eigen::Matrix<double,35,1> const data, Eigen::Matrix<std::complex<double>,4,10> & sols){

Eigen::Matrix<double, 26, 26> C0;
Eigen::Matrix<double, 26, 10> C1;

setup_elimination_template(data, C0, C1);



C1 = C0.lu().solve(C1);



Eigen::Matrix<double, 17, 10> RR;

RR.topRows(7) = -C1.bottomRows(7);
RR.bottomRows(10) = Eigen::MatrixXd::Identity(10,10);

int ind[10] = {0,1,8,2,3,10,4,5,13,6};

Eigen::Matrix<double, 10, 10> AM;



for (int i = 0; i < 10; i++)
{
    AM.row(i) = RR.row(ind[i]);
}

Eigen::EigenSolver<Eigen::MatrixXd> eig(AM);
Eigen::Matrix<std::complex<double>,10,1> D = eig.eigenvalues();
Eigen::Matrix<std::complex<double>,10,10> V = eig.eigenvectors();


Eigen::Matrix<std::complex<double>,10,1> scale = D.array()/V.row(9).array().transpose();

V = V.array() * (Eigen::Matrix<double,10,1>::Ones() * scale.transpose()).array();


sols.row(0) << V.row(2);
sols.row(1) << V.row(8);
sols.row(2) << D.transpose();
sols.row(3) << V.row(4).array() / sols.row(1).array().pow(2);
return 0;
}